

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::processCancel(Application *this,string *id,string *symbol,Side side)

{
  Side side_00;
  Order *this_00;
  string local_70;
  string local_50;
  Order *local_30;
  Order *order;
  string *psStack_20;
  Side side_local;
  string *symbol_local;
  string *id_local;
  Application *this_local;
  
  order._4_4_ = side;
  psStack_20 = symbol;
  symbol_local = id;
  id_local = (string *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)symbol);
  side_00 = order._4_4_;
  std::__cxx11::string::string((string *)&local_70,(string *)symbol_local);
  this_00 = OrderMatcher::find(&this->m_orderMatcher,&local_50,side_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = this_00;
  Order::cancel(this_00);
  cancelOrder(this,local_30);
  OrderMatcher::erase(&this->m_orderMatcher,local_30);
  return;
}

Assistant:

void Application::processCancel(const std::string &id, const std::string &symbol, Order::Side side) {
  Order &order = m_orderMatcher.find(symbol, side, id);
  order.cancel();
  cancelOrder(order);
  m_orderMatcher.erase(order);
}